

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxcbbackingstore.cpp
# Opt level: O3

FlushResult __thiscall
QXcbBackingStore::rhiFlush
          (QXcbBackingStore *this,QWindow *window,qreal sourceDevicePixelRatio,QRegion *region,
          QPoint *offset,QPlatformTextureList *textures,bool translucentBackground)

{
  bool bVar1;
  FlushResult FVar2;
  undefined8 uVar3;
  long lVar4;
  QXcbWindow *this_00;
  
  FVar2 = FlushFailed;
  if (this->m_image != (QXcbBackingStoreImage *)0x0) {
    uVar3 = QImage::size();
    if (0 < (int)((ulong)uVar3 >> 0x20) && 0 < (int)uVar3) {
      QXcbBackingStoreImage::flushScrolledRegion(this->m_image,true);
      FVar2 = QPlatformBackingStore::rhiFlush
                        ((QWindow *)this,sourceDevicePixelRatio,(QRegion *)window,(QPoint *)region,
                         (QPlatformTextureList *)offset,SUB81(textures,0));
      if (FVar2 == FlushSuccess) {
        lVar4 = QWindow::handle();
        this_00 = (QXcbWindow *)(lVar4 + -0x20);
        if (lVar4 == 0) {
          this_00 = (QXcbWindow *)0x0;
        }
        bVar1 = QXcbWindow::needsSync(this_00);
        if (bVar1) {
          QXcbWindow::updateSyncRequestCounter(this_00);
        }
        else {
          xcb_flush((((this->super_QXcbObject).m_connection)->super_QXcbBasicConnection).
                    m_xcbConnection);
        }
        FVar2 = FlushSuccess;
      }
    }
  }
  return FVar2;
}

Assistant:

QPlatformBackingStore::FlushResult QXcbBackingStore::rhiFlush(QWindow *window,
                                                              qreal sourceDevicePixelRatio,
                                                              const QRegion &region,
                                                              const QPoint &offset,
                                                              QPlatformTextureList *textures,
                                                              bool translucentBackground)
{
    if (!m_image || m_image->size().isEmpty())
        return FlushFailed;

    m_image->flushScrolledRegion(true);

    auto result = QPlatformBackingStore::rhiFlush(window, sourceDevicePixelRatio, region, offset,
                                                  textures, translucentBackground);
    if (result != FlushSuccess)
        return result;
    QXcbWindow *platformWindow = static_cast<QXcbWindow *>(window->handle());
    if (platformWindow->needsSync()) {
        platformWindow->updateSyncRequestCounter();
    } else {
        xcb_flush(xcb_connection());
    }

    return FlushSuccess;
}